

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void WebRtcSpl_Resample16khzTo22khz
               (int16_t *in,int16_t *out,WebRtcSpl_State16khzTo22khz *state,int32_t *tmpmem)

{
  int local_2c;
  int k;
  int32_t *tmpmem_local;
  WebRtcSpl_State16khzTo22khz *state_local;
  int16_t *out_local;
  int16_t *in_local;
  
  state_local = (WebRtcSpl_State16khzTo22khz *)out;
  out_local = in;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    WebRtcSpl_UpBy2ShortToInt(out_local,0x28,tmpmem + 8,state->S_16_32);
    *tmpmem = state->S_32_22[0];
    tmpmem[1] = state->S_32_22[1];
    tmpmem[2] = state->S_32_22[2];
    tmpmem[3] = state->S_32_22[3];
    tmpmem[4] = state->S_32_22[4];
    tmpmem[5] = state->S_32_22[5];
    tmpmem[6] = state->S_32_22[6];
    tmpmem[7] = state->S_32_22[7];
    state->S_32_22[0] = tmpmem[0x50];
    state->S_32_22[1] = tmpmem[0x51];
    state->S_32_22[2] = tmpmem[0x52];
    state->S_32_22[3] = tmpmem[0x53];
    state->S_32_22[4] = tmpmem[0x54];
    state->S_32_22[5] = tmpmem[0x55];
    state->S_32_22[6] = tmpmem[0x56];
    state->S_32_22[7] = tmpmem[0x57];
    WebRtcSpl_32khzTo22khzIntToShort(tmpmem,(int16_t *)state_local,5);
    out_local = out_local + 0x28;
    state_local = (WebRtcSpl_State16khzTo22khz *)((long)state_local[1].S_32_22 + 0xe);
  }
  return;
}

Assistant:

void WebRtcSpl_Resample16khzTo22khz(const int16_t* in, int16_t* out,
                                    WebRtcSpl_State16khzTo22khz* state, int32_t* tmpmem)
{
    int k;

    // process two blocks of 10/SUB_BLOCKS_16_22 ms (to reduce temp buffer size)
    for (k = 0; k < SUB_BLOCKS_16_22; k++)
    {
        ///// 16 --> 32 /////
        // int16_t  in[160/SUB_BLOCKS_16_22]
        // int32_t out[320/SUB_BLOCKS_16_22]
        /////
        WebRtcSpl_UpBy2ShortToInt(in, 160 / SUB_BLOCKS_16_22, tmpmem + 8, state->S_16_32);

        ///// 32 --> 22 /////
        // int32_t  in[320/SUB_BLOCKS_16_22]
        // int32_t out[220/SUB_BLOCKS_16_22]
        /////
        // copy state to and from input array
        tmpmem[0] = state->S_32_22[0];
        tmpmem[1] = state->S_32_22[1];
        tmpmem[2] = state->S_32_22[2];
        tmpmem[3] = state->S_32_22[3];
        tmpmem[4] = state->S_32_22[4];
        tmpmem[5] = state->S_32_22[5];
        tmpmem[6] = state->S_32_22[6];
        tmpmem[7] = state->S_32_22[7];
        state->S_32_22[0] = tmpmem[320 / SUB_BLOCKS_16_22];
        state->S_32_22[1] = tmpmem[320 / SUB_BLOCKS_16_22 + 1];
        state->S_32_22[2] = tmpmem[320 / SUB_BLOCKS_16_22 + 2];
        state->S_32_22[3] = tmpmem[320 / SUB_BLOCKS_16_22 + 3];
        state->S_32_22[4] = tmpmem[320 / SUB_BLOCKS_16_22 + 4];
        state->S_32_22[5] = tmpmem[320 / SUB_BLOCKS_16_22 + 5];
        state->S_32_22[6] = tmpmem[320 / SUB_BLOCKS_16_22 + 6];
        state->S_32_22[7] = tmpmem[320 / SUB_BLOCKS_16_22 + 7];

        WebRtcSpl_32khzTo22khzIntToShort(tmpmem, out, 20 / SUB_BLOCKS_16_22);

        // move input/output pointers 10/SUB_BLOCKS_16_22 ms seconds ahead
        in += 160 / SUB_BLOCKS_16_22;
        out += 220 / SUB_BLOCKS_16_22;
    }
}